

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O0

shared_ptr<const_HawkTracer::parser::EventKlassField> __thiscall
HawkTracer::parser::EventKlass::_get_field(EventKlass *this,char *name,bool recursive)

{
  bool bVar1;
  int iVar2;
  FieldTypeId FVar3;
  char *__s2;
  element_type *this_00;
  element_type *name_00;
  byte in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  shared_ptr<const_HawkTracer::parser::EventKlassField> sVar5;
  undefined1 local_80 [24];
  undefined1 local_68 [40];
  shared_ptr<HawkTracer::parser::EventKlassField> *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  *__range2;
  bool recursive_local;
  char *name_local;
  EventKlass *this_local;
  shared_ptr<const_HawkTracer::parser::EventKlassField> *base_field;
  
  __end2 = std::
           vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
           ::begin((vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
                    *)(name + 0x28));
  field = (shared_ptr<HawkTracer::parser::EventKlassField> *)
          std::
          vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
          ::end((vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
                 *)(name + 0x28));
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::shared_ptr<HawkTracer::parser::EventKlassField>_*,_std::vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>_>
                                *)&field);
    if (!bVar1) {
      std::shared_ptr<const_HawkTracer::parser::EventKlassField>::shared_ptr
                ((shared_ptr<const_HawkTracer::parser::EventKlassField> *)this,(nullptr_t)0x0);
      _Var4._M_pi = extraout_RDX_02;
LAB_0013501e:
      sVar5.
      super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      sVar5.
      super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (shared_ptr<const_HawkTracer::parser::EventKlassField>)
             sVar5.
             super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    local_68._32_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<HawkTracer::parser::EventKlassField>_*,_std::vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>_>
         ::operator*(&__end2);
    std::
    __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_68._32_8_);
    EventKlassField::get_name_abi_cxx11_((EventKlassField *)local_68);
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcmp((char *)CONCAT71(in_register_00000011,recursive),__s2);
    std::__cxx11::string::~string((string *)local_68);
    if (iVar2 == 0) {
      std::shared_ptr<HawkTracer::parser::EventKlassField_const>::
      shared_ptr<HawkTracer::parser::EventKlassField,void>
                ((shared_ptr<HawkTracer::parser::EventKlassField_const> *)this,
                 (shared_ptr<HawkTracer::parser::EventKlassField> *)local_68._32_8_);
      _Var4._M_pi = extraout_RDX;
      goto LAB_0013501e;
    }
    this_00 = std::
              __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_68._32_8_);
    FVar3 = EventKlassField::get_type_id(this_00);
    if ((FVar3 == STRUCT) && ((in_CL & 1) != 0)) {
      local_80[0x17] = 0;
      std::
      __shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_68._32_8_);
      EventKlassField::get_klass((EventKlassField *)local_80);
      name_00 = std::
                __shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_80);
      get_field(this,(char *)name_00,recursive);
      std::shared_ptr<const_HawkTracer::parser::EventKlass>::~shared_ptr
                ((shared_ptr<const_HawkTracer::parser::EventKlass> *)local_80);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
      if (bVar1) {
        local_80[0x17] = 1;
      }
      _Var4._M_pi = extraout_RDX_00;
      if ((local_80[0x17] & 1) == 0) {
        std::shared_ptr<const_HawkTracer::parser::EventKlassField>::~shared_ptr
                  ((shared_ptr<const_HawkTracer::parser::EventKlassField> *)this);
        _Var4._M_pi = extraout_RDX_01;
      }
      if (bVar1) goto LAB_0013501e;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<HawkTracer::parser::EventKlassField>_*,_std::vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::shared_ptr<const EventKlassField> EventKlass::_get_field(const char* name, bool recursive) const
{
    for (const auto& field : _fields)
    {
        if (strcmp(name, field->get_name().c_str()) == 0)
        {
            return field;
        }
        else if (field->get_type_id() == FieldTypeId::STRUCT && recursive)
        {
            auto base_field = field->get_klass()->get_field(name, recursive);
            if (base_field)
            {
                return base_field;
            }
        }
    }

    return nullptr;
}